

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmd160.c
# Opt level: O2

int rmd160_init(hash_state *md)

{
  if (md == (hash_state *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/Cyan4973[P]smhasher/rmd160.c",0x14a);
  }
  (md->sha3).s[10] = 0xc3d2e1f010325476;
  (md->sha3).s[8] = 0x6745230100000000;
  (md->sha3).s[9] = 0x98badcfeefcdab89;
  (md->chc).length = 0;
  return 0;
}

Assistant:

int rmd160_init(hash_state * md)
{
   LTC_ARGCHK(md != NULL);
   md->rmd160.state[0] = 0x67452301UL;
   md->rmd160.state[1] = 0xefcdab89UL;
   md->rmd160.state[2] = 0x98badcfeUL;
   md->rmd160.state[3] = 0x10325476UL;
   md->rmd160.state[4] = 0xc3d2e1f0UL;
   md->rmd160.curlen   = 0;
   md->rmd160.length   = 0;
   return CRYPT_OK;
}